

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_numpow_kx(jit_State *J)

{
  TRef TVar1;
  jit_State *in_RDI;
  lua_Number n;
  double u64;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  u64 = *(double *)(ulong)(in_RDI->fold).left.field_1.op12;
  if ((u64 != 2.0) || (NAN(u64))) {
    TVar1 = 0;
  }
  else {
    (in_RDI->fold).ins.field_1.o = 'U';
    (in_RDI->fold).ins.field_0.op1 = (in_RDI->fold).ins.field_0.op2;
    (in_RDI->fold).ins.field_0.op2 = 0x1d3;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_ir_knum_u64(in_RDI,(uint64_t)u64);
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (in_RDI->fold).ins.field_1.o = '1';
    TVar1 = 1;
  }
  return TVar1;
}

Assistant:

LJFOLD(POW KNUM any)
LJFOLDF(simplify_numpow_kx)
{
  lua_Number n = knumleft;
  if (n == 2.0) {  /* 2.0 ^ i ==> ldexp(1.0, tonum(i)) */
    fins->o = IR_CONV;
#if LJ_TARGET_X86ORX64
    fins->op1 = fins->op2;
    fins->op2 = IRCONV_NUM_INT;
    fins->op2 = (IRRef1)lj_opt_fold(J);
#endif
    fins->op1 = (IRRef1)lj_ir_knum_one(J);
    fins->o = IR_LDEXP;
    return RETRYFOLD;
  }
  return NEXTFOLD;
}